

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GridDataType2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType2 *this)

{
  float *pfVar1;
  ostream *poVar2;
  float *pfVar3;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  GridData::GetAsString_abi_cxx11_(&local_1d0,&this->super_GridData);
  poVar2 = std::operator<<(local_1a0,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"GridDataType2:");
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Values: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)&(this->super_GridData).field_0xc);
  std::operator<<(poVar2,"\n\tValues: ");
  std::__cxx11::string::~string((string *)&local_1d0);
  pfVar1 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar3 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
    poVar2 = std::operator<<(local_1a0," ");
    std::ostream::operator<<(poVar2,*pfVar3);
  }
  std::operator<<(local_1a0,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType2::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType2:"
       << "\n\tNumber Of Values: " << m_ui16NumValues
       << "\n\tValues: ";

    vector<KFLOAT32>::const_iterator citr = m_vf32Values.begin();
    vector<KFLOAT32>::const_iterator citrEnd = m_vf32Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << *citr;
    }
    ss << "\n";

    return ss.str();
}